

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_func_queue_examples.cpp
# Opt level: O3

void __thiscall
density_tests::
LfFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::func_queue_try_put_samples::Func::operator()(Func *this)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = *(char **)this;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1069148);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  pcVar1 = *(char **)(this + 2);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1069148);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return;
}

Assistant:

void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }